

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O0

void __thiscall
tchecker::zg::global_extra_lu_t::extrapolate
          (global_extra_lu_t *this,db_t *dbm,clock_id_t dim,vloc_t *vloc)

{
  clock_id_t cVar1;
  element_type *peVar2;
  map_t *pmVar3;
  int *l;
  int *u;
  vloc_t *vloc_local;
  clock_id_t dim_local;
  db_t *dbm_local;
  global_extra_lu_t *this_local;
  
  peVar2 = std::
           __shared_ptr_access<const_tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_global_lu_extrapolation_t)._clock_bounds);
  cVar1 = clockbounds::global_lu_map_t::clock_number(peVar2);
  if (dim == cVar1 + 1) {
    peVar2 = std::
             __shared_ptr_access<const_tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_global_lu_extrapolation_t)._clock_bounds);
    pmVar3 = clockbounds::global_lu_map_t::L(peVar2);
    l = make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>::ptr(pmVar3);
    peVar2 = std::
             __shared_ptr_access<const_tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_global_lu_extrapolation_t)._clock_bounds);
    pmVar3 = clockbounds::global_lu_map_t::U(peVar2);
    u = make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>::ptr(pmVar3);
    tchecker::dbm::extra_lu(dbm,dim,l,u);
    return;
  }
  __assert_fail("dim == _clock_bounds->clock_number() + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/zg/extrapolation.cc"
                ,0x23,
                "virtual void tchecker::zg::global_extra_lu_t::extrapolate(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::vloc_t &)"
               );
}

Assistant:

void global_extra_lu_t::extrapolate(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, tchecker::vloc_t const & vloc)
{
  assert(dim == _clock_bounds->clock_number() + 1);
  tchecker::dbm::extra_lu(dbm, dim, _clock_bounds->L().ptr(), _clock_bounds->U().ptr());
}